

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O3

void xLearn::write_data(string *filename,string *data)

{
  FILE *file;
  int iVar1;
  
  file = OpenFileOrDie((filename->_M_dataplus)._M_p,"w");
  iVar1 = 100000;
  do {
    WriteDataToDisk(file,(data->_M_dataplus)._M_p,data->_M_string_length);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  Close(file);
  return;
}

Assistant:

void write_data(const std::string& filename,
                const std::string& data) {
  FILE* file = OpenFileOrDie(filename.c_str(), "w");
  for (int i = 0; i < kNum_lines; ++i) {
    WriteDataToDisk(file, data.data(), data.size());
  }
  Close(file);
}